

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O2

cl_program xmrig::OclCache::build(IOclRunner *runner)

{
  uint uVar1;
  int iVar2;
  cl_int cVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  cl_program program;
  char *pcVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint64_t uVar5;
  undefined4 extraout_var_04;
  cl_program program_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  uint64_t uVar6;
  undefined4 extraout_var_07;
  IOclRunner *runner_00;
  String SVar7;
  cl_device_id device;
  string s;
  int local_418;
  cl_int clStatus;
  size_t bin_size;
  char *data_ptr;
  string fileName;
  ostringstream ss;
  ifstream file;
  streambuf local_228 [16];
  int aiStack_218 [122];
  
  std::mutex::lock((mutex *)mutex);
  if (DAT_001bde58 == 0) {
    program = (cl_program)0x0;
    goto LAB_0016d192;
  }
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  fileName._M_string_length = 0;
  fileName.field_2._M_local_buf[0] = '\0';
  iVar2 = (*runner->_vptr_IOclRunner[6])(runner);
  if (*(char *)(CONCAT44(extraout_var,iVar2) + 8) == '\x01') {
    prefix_abi_cxx11_();
    std::operator+(&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bin_size
                   ,"/.cache/");
    cacheKey_abi_cxx11_((string *)&data_ptr,(OclCache *)runner,runner_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&s,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data_ptr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,".bin");
    std::__cxx11::string::operator=((string *)&fileName,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)&data_ptr);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&bin_size);
    std::ifstream::ifstream(&file,(string *)&fileName,_S_in|_S_bin);
    if (*(int *)((long)aiStack_218 + *(long *)(_file + -0x18)) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::ostream::operator<<((ostream *)&ss,local_228);
      std::__cxx11::stringbuf::str();
      bin_size = s._M_string_length;
      data_ptr = s._M_dataplus._M_p;
      iVar2 = (*runner->_vptr_IOclRunner[6])(runner);
      device = *(cl_device_id *)(CONCAT44(extraout_var_00,iVar2) + 0x20);
      iVar2 = (*runner->_vptr_IOclRunner[2])(runner);
      program = OclLib::createProgramWithBinary
                          ((cl_context)CONCAT44(extraout_var_01,iVar2),1,&device,&bin_size,
                           (uchar **)&data_ptr,&clStatus,&local_418);
      if (local_418 == 0) {
        cVar3 = OclLib::buildProgram
                          (program,1,&device,(char *)0x0,(_func_void_cl_program_void_ptr *)0x0,
                           (void *)0x0);
        if (cVar3 != 0) {
          OclLib::release(program);
          goto LAB_0016d00d;
        }
      }
      else {
LAB_0016d00d:
        program = (cl_program)0x0;
      }
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    }
    else {
      program = (cl_program)0x0;
    }
    std::ifstream::~ifstream(&file);
    if (program == (cl_program)0x0) goto LAB_0016d03d;
  }
  else {
LAB_0016d03d:
    pcVar4 = ocl_tag();
    (*runner->_vptr_IOclRunner[6])(runner);
    Log::print(INFO,"%s GPU \x1b[1;37m#%zu\x1b[0m \x1b[1;33mcompiling...\x1b[0m",pcVar4);
    iVar2 = (*runner->_vptr_IOclRunner[6])(runner);
    _ss = *(pointer *)(CONCAT44(extraout_var_02,iVar2) + 0x20);
    iVar2 = (*runner->_vptr_IOclRunner[5])(runner);
    s._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_03,iVar2);
    uVar5 = Chrono::steadyMSecs();
    iVar2 = (*runner->_vptr_IOclRunner[2])(runner);
    program_00 = OclLib::createProgramWithSource
                           ((cl_context)CONCAT44(extraout_var_04,iVar2),1,(char **)&s,(size_t *)0x0,
                            (cl_int *)&bin_size);
    program = (cl_program)0x0;
    if ((int)bin_size == 0) {
      iVar2 = (*runner->_vptr_IOclRunner[3])(runner);
      cVar3 = OclLib::buildProgram
                        (program_00,1,(cl_device_id *)&ss,(char *)CONCAT44(extraout_var_05,iVar2),
                         (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
      if (cVar3 == 0) {
        pcVar4 = ocl_tag();
        iVar2 = (*runner->_vptr_IOclRunner[6])(runner);
        uVar1 = *(uint *)(CONCAT44(extraout_var_06,iVar2) + 0x74);
        uVar6 = Chrono::steadyMSecs();
        Log::print(INFO,
                   "%s GPU \x1b[1;37m#%zu\x1b[0m \x1b[1;32mcompilation completed\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m"
                   ,pcVar4,(ulong)uVar1,uVar6 - uVar5);
        program = program_00;
      }
      else {
        SVar7 = OclLib::getProgramBuildLog((OclLib *)&file,program_00,(cl_device_id)_ss);
        printf("BUILD LOG:\n%s\n",_file,SVar7.m_size);
        String::~String((String *)&file);
        OclLib::release(program_00);
        program = (cl_program)0x0;
      }
    }
    iVar2 = (*runner->_vptr_IOclRunner[6])(runner);
    if ((program != (cl_program)0x0) && (*(char *)(CONCAT44(extraout_var_07,iVar2) + 8) != '\0')) {
      save(program,&fileName);
    }
  }
  std::__cxx11::string::~string((string *)&fileName);
LAB_0016d192:
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  return program;
}

Assistant:

cl_program xmrig::OclCache::build(const IOclRunner *runner)
{
    std::lock_guard<std::mutex> lock(mutex);

    if (Nonce::sequence(Nonce::OPENCL) == 0) {
        return nullptr;
    }

    std::string fileName;
    if (runner->data().cache) {
#       ifdef _WIN32
        fileName = prefix() + "\\xmrig\\.cache\\" + cacheKey(runner) + ".bin";
#       else
        fileName = prefix() + "/.cache/" + cacheKey(runner) + ".bin";
#       endif

        cl_program program = createFromBinary(runner, fileName);
        if (program) {
            return program;
        }
    }

    cl_program program = createFromSource(runner);
    if (runner->data().cache && program) {
        save(program, fileName);
    }

    return program;
}